

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

AffineSpace3fa * __thiscall embree::HeightField::get(HeightField *this,Vec2f *p)

{
  float *in_RDX;
  long in_RSI;
  AffineSpace3fa *in_RDI;
  float pz;
  float py;
  float px;
  Color4 c;
  size_t y;
  size_t x;
  size_t height;
  size_t width;
  ulong local_370;
  float local_35c;
  ulong local_350;
  float local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined1 local_2f8 [16];
  ulong local_2e8 [3];
  ulong local_2d0;
  ulong local_2c8 [3];
  ulong local_2b0;
  long local_2a8;
  long local_2a0;
  undefined8 *local_88;
  long *local_80;
  long *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong *local_60;
  ulong *local_58;
  ulong *local_50;
  ulong *local_48;
  undefined8 local_40;
  ulong local_38;
  undefined8 local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  ulong local_8;
  
  local_80 = (long *)(in_RSI + 0x10);
  local_2a0 = *(long *)(*local_80 + 0x10);
  local_2a8 = *(long *)(*local_80 + 0x18);
  local_31c = (float)(local_2a0 - 1);
  local_2c8[2] = (ulong)(*in_RDX * local_31c);
  local_2c8[2] = local_2c8[2] |
                 (long)(*in_RDX * local_31c - 9.223372e+18) & (long)local_2c8[2] >> 0x3f;
  local_2c8[1] = 0;
  local_2c8[0] = local_2a0 - 1;
  local_48 = local_2c8 + 2;
  local_50 = local_2c8 + 1;
  local_58 = local_2c8;
  local_350 = local_2c8[0];
  if (local_2c8[2] < local_2c8[0]) {
    local_350 = local_2c8[2];
  }
  local_40 = 0;
  local_38 = local_350;
  local_2b0 = local_350;
  local_35c = (float)(local_2a8 - 1);
  local_2e8[2] = (ulong)(in_RDX[1] * local_35c);
  local_2e8[2] = local_2e8[2] |
                 (long)(in_RDX[1] * local_35c - 9.223372e+18) & (long)local_2e8[2] >> 0x3f;
  local_2e8[1] = 0;
  local_2e8[0] = local_2a8 - 1;
  local_60 = local_2e8 + 2;
  local_68 = local_2e8 + 1;
  local_70 = local_2e8;
  local_370 = local_2e8[0];
  if (local_2e8[2] < local_2e8[0]) {
    local_370 = local_2e8[2];
  }
  local_30 = 0;
  local_28 = local_370;
  local_2d0 = local_370;
  local_88 = (undefined8 *)(in_RSI + 0x10);
  local_78 = local_80;
  local_20 = local_2c8[0];
  local_18 = local_2c8[2];
  local_10 = local_2e8[0];
  local_8 = local_2e8[2];
  (**(code **)(*(long *)*local_88 + 0x20))(local_2f8,(long *)*local_88,local_350,local_370);
  *(undefined8 *)&(in_RDI->l).vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = 0;
  *(undefined8 *)&(in_RDI->l).vy.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = 0;
  *(undefined8 *)&(in_RDI->l).vz.field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = 0x3f800000;
  *(undefined8 *)&(in_RDI->p).field_0 = local_318;
  *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uStack_310;
  return in_RDI;
}

Assistant:

const AffineSpace3fa get(Vec2f p)
    {
      const size_t width  = texture->width;
      const size_t height = texture->height;
      const size_t x = clamp((size_t)(p.x*(width-1)),(size_t)0,width-1);
      const size_t y = clamp((size_t)(p.y*(height-1)),(size_t)0,height-1);
      const Color4 c = texture->get(x,y);
      const float px = p.x*(bounds.upper.x-bounds.lower.x) + bounds.lower.x;
      const float py = c.r*(bounds.upper.y-bounds.lower.y) + bounds.lower.y;
      const float pz = p.y*(bounds.upper.z-bounds.lower.z) + bounds.lower.z;
      return AffineSpace3fa::translate(Vec3fa(px,py,pz));
    }